

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O1

int os_system_linux_netlink_add(os_system_netlink *nl,int protocol)

{
  uint uVar1;
  int __fd;
  int iVar2;
  nlmsghdr *pnVar3;
  uint *puVar4;
  char *pcVar5;
  oonf_log_source oVar6;
  char *pcVar7;
  char *format;
  sockaddr_nl addr;
  int recvbuf;
  
  __fd = socket(0x10,3,protocol);
  if (__fd < 0) {
    oVar6 = nl->used_by->logging;
    if ((log_global_mask[oVar6] & 4) == 0) goto LAB_001271c2;
    pcVar7 = nl->name;
    puVar4 = (uint *)__errno_location();
    pcVar5 = strerror(*puVar4);
    uVar1 = *puVar4;
    format = "Cannot open netlink socket \'%s\': %s (%d)";
    iVar2 = 0x103;
LAB_001271a9:
    oonf_log(LOG_SEVERITY_WARN,oVar6,"src/base/os_linux/os_system_linux.c",iVar2,(void *)0x0,0,
             format,pcVar7,pcVar5,(ulong)uVar1);
  }
  else {
    (nl->socket).fd.fd = __fd;
    (nl->socket).fd._flags = OS_FD_ACTIVE;
    iVar2 = abuf_init(&nl->out);
    if (iVar2 == 0) {
      abuf_memcpy(&nl->out,&_dummy_buffer,0x18);
      iVar2 = getpagesize();
      pnVar3 = (nlmsghdr *)calloc(1,(long)iVar2);
      nl->in = pnVar3;
      if (pnVar3 != (nlmsghdr *)0x0) {
        nl->in_len = (long)iVar2;
        addr.nl_groups = 0;
        addr.nl_family = 0x10;
        addr.nl_pad = 0;
        addr.nl_pid = 0;
        recvbuf = 0x100000;
        iVar2 = setsockopt((nl->socket).fd.fd,1,8,&recvbuf,4);
        if ((iVar2 != 0) && (oVar6 = nl->used_by->logging, (log_global_mask[oVar6] & 4) != 0)) {
          pcVar7 = nl->name;
          puVar4 = (uint *)__errno_location();
          pcVar5 = strerror(*puVar4);
          oonf_log(LOG_SEVERITY_WARN,oVar6,"src/base/os_linux/os_system_linux.c",0x124,(void *)0x0,0
                   ,"Cannot setup receive buffer size for netlink socket \'%s\': %s (%d)\n",pcVar7,
                   pcVar5,(ulong)*puVar4);
        }
        iVar2 = bind((nl->socket).fd.fd,(sockaddr *)&addr,0xc);
        if (-1 < iVar2) {
          (nl->socket).name = "os_system_netlink";
          (nl->socket).process = _netlink_handler;
          oonf_socket_add(&nl->socket);
          oonf_socket_set_read(&nl->socket,true);
          (nl->timeout).class = &_netlink_timer;
          (nl->buffered).prev = &nl->buffered;
          (nl->buffered).next = &nl->buffered;
          return 0;
        }
        oVar6 = nl->used_by->logging;
        if ((log_global_mask[oVar6] & 4) == 0) goto LAB_001271c2;
        pcVar7 = nl->name;
        puVar4 = (uint *)__errno_location();
        pcVar5 = strerror(*puVar4);
        uVar1 = *puVar4;
        format = "Could not bind netlink socket %s: %s (%d)";
        iVar2 = 0x129;
        goto LAB_001271a9;
      }
      oVar6 = nl->used_by->logging;
      if ((log_global_mask[oVar6] & 4) == 0) goto LAB_001271c2;
      pcVar7 = "Not enough memory for netlink \'%s\' input buffer";
      iVar2 = 0x116;
    }
    else {
      oVar6 = nl->used_by->logging;
      if ((log_global_mask[oVar6] & 4) == 0) goto LAB_001271c2;
      pcVar7 = "Not enough memory for netlink \'%s\'output buffer";
      iVar2 = 0x10f;
    }
    oonf_log(LOG_SEVERITY_WARN,oVar6,"src/base/os_linux/os_system_linux.c",iVar2,(void *)0x0,0,
             pcVar7,nl->name);
  }
LAB_001271c2:
  (nl->socket).fd.fd = 0;
  (nl->socket).fd.wanted_events = 0;
  (nl->socket).fd.received_events = 0;
  (nl->socket).fd._flags = 0;
  if (__fd != -1) {
    close(__fd);
  }
  free(nl->in);
  abuf_free(&nl->out);
  return -1;
}

Assistant:

int
os_system_linux_netlink_add(struct os_system_netlink *nl, int protocol) {
  struct sockaddr_nl addr;
  int recvbuf;
  int fd;

  fd = socket(PF_NETLINK, SOCK_RAW, protocol);
  if (fd < 0) {
    OONF_WARN(nl->used_by->logging, "Cannot open netlink socket '%s': %s (%d)", nl->name, strerror(errno), errno);
    goto os_add_netlink_fail;
  }

  if (os_fd_init(&nl->socket.fd, fd)) {
    OONF_WARN(nl->used_by->logging, "Could not initialize socket representation");
    goto os_add_netlink_fail;
  }
  if (abuf_init(&nl->out)) {
    OONF_WARN(nl->used_by->logging,
      "Not enough memory for"
      " netlink '%s'output buffer",
      nl->name);
    goto os_add_netlink_fail;
  }
  abuf_memcpy(&nl->out, &_dummy_buffer, sizeof(_dummy_buffer));

  nl->in = calloc(1, getpagesize());
  if (nl->in == NULL) {
    OONF_WARN(nl->used_by->logging, "Not enough memory for netlink '%s' input buffer", nl->name);
    goto os_add_netlink_fail;
  }
  nl->in_len = getpagesize();

  memset(&addr, 0, sizeof(addr));
  addr.nl_family = AF_NETLINK;

#if defined(SO_RCVBUF)
  recvbuf = 65536 * 16;
  if (setsockopt(nl->socket.fd.fd, SOL_SOCKET, SO_RCVBUF, &recvbuf, sizeof(recvbuf))) {
    OONF_WARN(nl->used_by->logging,
      "Cannot setup receive buffer size for"
      " netlink socket '%s': %s (%d)\n",
      nl->name, strerror(errno), errno);
  }
#endif

  if (bind(nl->socket.fd.fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
    OONF_WARN(nl->used_by->logging, "Could not bind netlink socket %s: %s (%d)", nl->name, strerror(errno), errno);
    goto os_add_netlink_fail;
  }

  nl->socket.name = "os_system_netlink";
  nl->socket.process = _netlink_handler;
  oonf_socket_add(&nl->socket);
  oonf_socket_set_read(&nl->socket, true);

  nl->timeout.class = &_netlink_timer;

  list_init_head(&nl->buffered);
  return 0;

os_add_netlink_fail:
  os_fd_invalidate(&nl->socket.fd);
  if (fd != -1) {
    close(fd);
  }
  free(nl->in);
  abuf_free(&nl->out);
  fd = -1;
  return -1;
}